

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall cmake::CreateAndSetGlobalGenerator(cmake *this,string *name,bool allowArch)

{
  undefined1 auVar1 [8];
  bool bVar2;
  long lVar3;
  string_view str;
  string vsError;
  string kdevError;
  _Head_base<0UL,_cmGlobalGenerator_*,_false> local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  CreateGlobalGenerator((cmake *)local_88,(string *)this,SUB81(name,0));
  auVar1 = local_88;
  if (local_88 == (undefined1  [8])0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = _S_red;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    lVar3 = std::__cxx11::string::find((char *)name,0x734ee9);
    if (lVar3 != -1) {
      std::__cxx11::string::assign((char *)&local_60);
    }
    if (!allowArch) {
      str._M_str = (name->_M_dataplus)._M_p;
      str._M_len = name->_M_string_length;
      bVar2 = cmHasLiteralPrefix<15ul>(str,(char (*) [15])"Visual Studio ");
      if (bVar2 && 0x15 < name->_M_string_length) {
        std::__cxx11::string::assign(local_88 + 8);
      }
    }
    cmStrCat<char_const(&)[34],std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&>
              (&local_40,(char (*) [34])"Could not create named generator ",name,&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8));
    cmSystemTools::Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    PrintGeneratorList(this);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    local_90._M_head_impl = (cmGlobalGenerator *)local_88;
    local_88 = (undefined1  [8])0x0;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_90);
    if (local_90._M_head_impl != (cmGlobalGenerator *)0x0) {
      (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                   *)&(local_90._M_head_impl)->_vptr_cmGlobalGenerator)->
                super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                )._M_t.
                super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
                _vptr_cmGlobalGeneratorFactory)();
    }
    local_90._M_head_impl = (cmGlobalGenerator *)0x0;
  }
  if (local_88 != (undefined1  [8])0x0) {
    (*(code *)(((__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                 *)local_88)->
              super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
              )._M_t.
              super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
              .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
              _vptr_cmGlobalGeneratorFactory)();
  }
  return auVar1 != (undefined1  [8])0x0;
}

Assistant:

bool cmake::CreateAndSetGlobalGenerator(const std::string& name,
                                        bool allowArch)
{
  auto gen = this->CreateGlobalGenerator(name, allowArch);
  if (!gen) {
    std::string kdevError;
    std::string vsError;
    if (name.find("KDevelop3", 0) != std::string::npos) {
      kdevError = "\nThe KDevelop3 generator is not supported anymore.";
    }
    if (!allowArch && cmHasLiteralPrefix(name, "Visual Studio ") &&
        name.length() >= cmStrLen("Visual Studio xx xxxx ")) {
      vsError = "\nUsing platforms in Visual Studio generator names is not "
                "supported in CMakePresets.json.";
    }

    cmSystemTools::Error(
      cmStrCat("Could not create named generator ", name, kdevError, vsError));
    this->PrintGeneratorList();
    return false;
  }

  this->SetGlobalGenerator(std::move(gen));
  return true;
}